

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

Result * __thiscall
CoreML::Model::addInput
          (Result *__return_storage_ptr__,Model *this,string *featureName,FeatureType *featureType)

{
  element_type *peVar1;
  string *psVar2;
  ModelDescription *this_00;
  Type *pTVar3;
  FeatureType *pFVar4;
  
  peVar1 = (this->m_spec).
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = peVar1->description_;
  if (this_00 == (ModelDescription *)0x0) {
    this_00 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(this_00);
    peVar1->description_ = this_00;
  }
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(this_00->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  psVar2 = (pTVar3->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar3->name_,featureName);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  pFVar4 = FeatureType::allocateCopy(featureType);
  if (pTVar3->type_ != (FeatureType *)0x0) {
    (*(pTVar3->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar3->type_ = pFVar4;
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result Model::addInput(const std::string& featureName,
                           FeatureType featureType) {
        Specification::ModelDescription* interface = m_spec->mutable_description();
        Specification::FeatureDescription *arg = interface->add_input();
        arg->set_name(featureName);
        arg->set_allocated_type(featureType.allocateCopy());
        return Result();
    }